

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::_InternalSerialize
          (MapEntryImpl<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
           *this,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  uint8_t *puVar2;
  undefined4 extraout_var_00;
  EpsCopyOutputStream *stream_local;
  uint8_t *ptr_local;
  MapEntryImpl<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_local;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  puVar2 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Write(1,(MapEntryAccessorType *)CONCAT44(extraout_var,iVar1),ptr,stream);
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])();
  puVar2 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Block>
           ::Write(2,(MapEntryAccessorType *)CONCAT44(extraout_var_00,iVar1),puVar2,stream);
  return puVar2;
}

Assistant:

::uint8_t* _InternalSerialize(
      ::uint8_t* ptr, io::EpsCopyOutputStream* stream) const override {
    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key(), ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value(), ptr, stream);
  }